

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

CodeLocation * __thiscall
testing::internal::TypedTestSuitePState::GetCodeLocation
          (TypedTestSuitePState *this,string *test_name)

{
  bool bVar1;
  const_iterator cVar2;
  GTestLog local_14;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find(&(this->registered_tests_)._M_t,test_name);
  bVar1 = IsTrue((_Rb_tree_header *)cVar2._M_node !=
                 &(this->registered_tests_)._M_t._M_impl.super__Rb_tree_header);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x271);
    std::operator<<((ostream *)&std::cerr,"Condition it != registered_tests_.end() failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  return (CodeLocation *)(cVar2._M_node + 2);
}

Assistant:

const CodeLocation& GetCodeLocation(const std::string& test_name) const {
    RegisteredTestsMap::const_iterator it = registered_tests_.find(test_name);
    GTEST_CHECK_(it != registered_tests_.end());
    return it->second;
  }